

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O2

Result __thiscall
wabt::anon_unknown_15::BinaryReaderIR::BeginGlobal
          (BinaryReaderIR *this,Index index,Type type,bool mutable_)

{
  anon_struct_3_3_4b311855_for_features_used *paVar1;
  bool *pbVar2;
  Module *pMVar3;
  pointer *__ptr;
  _Head_base<0UL,_wabt::GlobalModuleField_*,_false> local_58;
  undefined1 local_50 [40];
  
  GetLocation((Location *)(local_50 + 8),this);
  std::make_unique<wabt::GlobalModuleField,wabt::Location>((Location *)local_50);
  ((Global *)(local_50._0_8_ + 0x40))->type = type;
  ((Global *)(local_50._0_8_ + 0x40))->mutable_ = mutable_;
  local_58._M_head_impl = (GlobalModuleField *)local_50._0_8_;
  local_50._0_8_ = (long *)0x0;
  Module::AppendField(this->module_,
                      (unique_ptr<wabt::GlobalModuleField,_std::default_delete<wabt::GlobalModuleField>_>
                       *)&local_58);
  if (local_58._M_head_impl != (GlobalModuleField *)0x0) {
    (*((local_58._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)1>).super_ModuleField.
      _vptr_ModuleField[1])();
  }
  local_58._M_head_impl = (GlobalModuleField *)0x0;
  pMVar3 = this->module_;
  paVar1 = &pMVar3->features_used;
  paVar1->simd = (bool)(paVar1->simd | type.enum_ == V128);
  pbVar2 = &(pMVar3->features_used).exceptions;
  *pbVar2 = (bool)(*pbVar2 | type.enum_ == ExnRef);
  if ((long *)local_50._0_8_ != (long *)0x0) {
    (**(code **)(*(long *)local_50._0_8_ + 8))();
  }
  return (Result)Ok;
}

Assistant:

Result BinaryReaderIR::BeginGlobal(Index index, Type type, bool mutable_) {
  auto field = std::make_unique<GlobalModuleField>(GetLocation());
  Global& global = field->global;
  global.type = type;
  global.mutable_ = mutable_;
  module_->AppendField(std::move(field));
  module_->features_used.simd |= (type == Type::V128);
  module_->features_used.exceptions |= (type == Type::ExnRef);
  return Result::Ok;
}